

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

double ddCountPathAux(DdNode *node,st__table *table)

{
  int iVar1;
  char *local_58;
  double *dummy;
  double paths2;
  double paths1;
  double *ppaths;
  double paths;
  DdNode *Nnv;
  DdNode *Nv;
  st__table *table_local;
  DdNode *node_local;
  
  if (node->index == 0x7fffffff) {
    node_local = (DdNode *)0x3ff0000000000000;
  }
  else {
    Nv = (DdNode *)table;
    table_local = (st__table *)node;
    iVar1 = st__lookup(table,(char *)node,&local_58);
    if (iVar1 == 0) {
      Nnv = *(DdNode **)&table_local->num_bins;
      paths = *(double *)&table_local->max_density;
      paths2 = ddCountPathAux(Nnv,(st__table *)Nv);
      if ((paths2 != -1.0) || (NAN(paths2))) {
        dummy = (double *)
                ddCountPathAux((DdNode *)((ulong)paths & 0xfffffffffffffffe),(st__table *)Nv);
        if (((double)dummy != -1.0) || (NAN((double)dummy))) {
          ppaths = (double *)(paths2 + (double)dummy);
          paths1 = (double)malloc(8);
          if ((char *)paths1 == (char *)0x0) {
            node_local = (DdNode *)0xbff0000000000000;
          }
          else {
            *(double **)paths1 = ppaths;
            iVar1 = st__add_direct((st__table *)Nv,(char *)table_local,(char *)paths1);
            if (iVar1 == -10000) {
              if (paths1 != 0.0) {
                free((void *)paths1);
              }
              node_local = (DdNode *)0xbff0000000000000;
            }
            else {
              node_local = (DdNode *)ppaths;
            }
          }
        }
        else {
          node_local = (DdNode *)0xbff0000000000000;
        }
      }
      else {
        node_local = (DdNode *)0xbff0000000000000;
      }
    }
    else {
      node_local = *(DdNode **)local_58;
    }
  }
  return (double)node_local;
}

Assistant:

static double
ddCountPathAux(
  DdNode * node,
  st__table * table)
{

    DdNode      *Nv, *Nnv;
    double      paths, *ppaths, paths1, paths2;
    double      *dummy;


    if (cuddIsConstant(node)) {
        return(1.0);
    }
    if ( st__lookup(table, (const char *)node, (char **)&dummy)) {
        paths = *dummy;
        return(paths);
    }

    Nv = cuddT(node); Nnv = cuddE(node);

    paths1 = ddCountPathAux(Nv,table);
    if (paths1 == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    paths2 = ddCountPathAux(Cudd_Regular(Nnv),table);
    if (paths2 == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    paths = paths1 + paths2;

    ppaths = ABC_ALLOC(double,1);
    if (ppaths == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }

    *ppaths = paths;

    if ( st__add_direct(table,(char *)node, (char *)ppaths) == st__OUT_OF_MEM) {
        ABC_FREE(ppaths);
        return((double)CUDD_OUT_OF_MEM);
    }
    return(paths);

}